

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::heaptype<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx)

{
  __index_type *p_Var1;
  undefined8 uVar2;
  bool bVar3;
  Ok *pOVar4;
  bool bVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  allocator<char> local_241;
  string local_240;
  Err local_220;
  Err local_200;
  Err *local_1e0;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> t;
  Ok local_172;
  allocator<char> local_171;
  Shareability share;
  Err local_150;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> t_2;
  Err local_a0;
  Err *local_80;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  undefined1 local_40 [8];
  MaybeResult<wasm::Ok> t_1;
  NullCtx *ctx_local;
  
  t_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = ctx;
  maybeTypeidx<wasm::WATParser::NullCtx>((MaybeResult<wasm::Ok> *)local_40,ctx);
  bVar3 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_40);
  if (bVar3) {
    MaybeResult<wasm::Ok>::MaybeResult
              ((MaybeResult<wasm::Ok> *)&err,(MaybeResult<wasm::Ok> *)local_40);
    local_80 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
    bVar3 = local_80 != (Err *)0x0;
    if (bVar3) {
      wasm::Err::Err(&local_a0,local_80);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
    }
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
    if (!bVar3) {
      pOVar4 = MaybeResult<wasm::Ok>::operator*((MaybeResult<wasm::Ok> *)local_40);
      Result<wasm::Ok>::Result<wasm::Ok&>(__return_storage_ptr__,pOVar4);
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_40);
  uVar2 = t_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
  if (!bVar3) {
    bVar6 = sv("exact",5);
    bVar3 = Lexer::takeSExprStart((Lexer *)uVar2,bVar6);
    uVar2 = t_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
    if (bVar3) {
      p_Var1 = (__index_type *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      typeidx<wasm::WATParser::NullCtx>
                ((Result<wasm::Ok> *)p_Var1,
                 (NullCtx *)
                 t_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
      Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_1,(Result<wasm::Ok> *)p_Var1);
      local_110 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
      bVar3 = local_110 == (Err *)0x0;
      if (!bVar3) {
        wasm::Err::Err(&local_130,local_110);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_130);
        wasm::Err::~Err(&local_130);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
      if (bVar3) {
        bVar3 = Lexer::takeRParen((Lexer *)t_1.val.
                                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           ._32_8_);
        uVar2 = t_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
        if (bVar3) {
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          NullTypeParserCtx::makeExact((NullTypeParserCtx *)uVar2);
          Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_172);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&share,"expected end of exact heap type",&local_171);
          Lexer::err(&local_150,(Lexer *)uVar2,(string *)&share);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_150);
          wasm::Err::~Err(&local_150);
          std::__cxx11::string::~string((string *)&share);
          std::allocator<char>::~allocator(&local_171);
        }
      }
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    else {
      bVar6 = sv("shared",6);
      bVar3 = Lexer::takeSExprStart((Lexer *)uVar2,bVar6);
      p_Var1 = (__index_type *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      absheaptype<wasm::WATParser::NullCtx>
                ((Result<wasm::Ok> *)p_Var1,
                 (NullCtx *)
                 t_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_,(uint)!bVar3);
      Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_2,(Result<wasm::Ok> *)p_Var1);
      local_1e0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar5 = local_1e0 == (Err *)0x0;
      if (!bVar5) {
        wasm::Err::Err(&local_200,local_1e0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_200);
        wasm::Err::~Err(&local_200);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (bVar5) {
        if ((!bVar3 != Shared) ||
           (bVar3 = Lexer::takeRParen((Lexer *)t_1.val.
                                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                               .
                                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                               ._32_8_),
           uVar2 = t_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_, bVar3)) {
          pOVar4 = Result<wasm::Ok>::operator*
                             ((Result<wasm::Ok> *)
                              ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          Result<wasm::Ok>::Result<wasm::Ok&>(__return_storage_ptr__,pOVar4);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,"expected end of shared abstract heap type",&local_241);
          Lexer::err(&local_220,(Lexer *)uVar2,&local_240);
          Result<wasm::Ok>::Result(__return_storage_ptr__,&local_220);
          wasm::Err::~Err(&local_220);
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator(&local_241);
        }
      }
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> heaptype(Ctx& ctx) {
  if (auto t = maybeTypeidx(ctx)) {
    CHECK_ERR(t);
    return *t;
  }

  if (ctx.in.takeSExprStart("exact"sv)) {
    auto t = typeidx(ctx);
    CHECK_ERR(t);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of exact heap type");
    }
    return ctx.makeExact(*t);
  }

  auto share = ctx.in.takeSExprStart("shared"sv) ? Shared : Unshared;
  auto t = absheaptype(ctx, share);
  CHECK_ERR(t);
  if (share == Shared && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of shared abstract heap type");
  }
  return *t;
}